

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

vector<int,_std::allocator<int>_> * __thiscall
despot::Parser::ComputeState
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,Parser *this,double random)

{
  pointer pTVar1;
  pointer piVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  allocator_type local_31;
  double local_30;
  
  local_30 = random;
  std::vector<int,_std::allocator<int>_>::vector
            (__return_storage_ptr__,
             ((long)(this->curr_state_vars_).
                    super__Vector_base<despot::StateVar,_std::allocator<despot::StateVar>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(this->curr_state_vars_).
                    super__Vector_base<despot::StateVar,_std::allocator<despot::StateVar>_>._M_impl.
                    super__Vector_impl_data._M_start >> 6) * -0x5555555555555555,&local_31);
  if ((__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
      super__Vector_impl_data._M_finish !=
      (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
      super__Vector_impl_data._M_start) {
    lVar4 = 0;
    uVar5 = 0;
    do {
      pTVar1 = (this->initial_belief_funcs_).
               super__Vector_base<despot::TabularCPT,_std::allocator<despot::TabularCPT>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar3 = (**(code **)(*(long *)((long)&(pTVar1->super_CPT).super_Function._vptr_Function +
                                    lVar4) + 0x70))
                        ((long)&(pTVar1->super_CPT).super_Function._vptr_Function + lVar4,&local_30)
      ;
      piVar2 = (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      piVar2[uVar5] = iVar3;
      uVar5 = uVar5 + 1;
      lVar4 = lVar4 + 0x70;
    } while (uVar5 < (ulong)((long)(__return_storage_ptr__->
                                   super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                   super__Vector_impl_data._M_finish - (long)piVar2 >> 2));
  }
  return __return_storage_ptr__;
}

Assistant:

vector<int> Parser::ComputeState(double random) const {
	vector<int> state(curr_state_vars_.size());
	for (int s = 0; s < state.size(); s++) {
		state[s] = initial_belief_funcs_[s].ComputeCurrentIndex(random);
	}

	return state;
}